

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall
FPathTraverse::AddThingIntercepts
          (FPathTraverse *this,int bx,int by,FBlockThingsIterator *it,bool compatible)

{
  divline_t *line;
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  anon_union_8_2_50eab53d_for_d aVar6;
  undefined3 in_register_00000081;
  undefined4 uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  intercept_t newintercept;
  divline_t local_b8;
  double local_98;
  undefined8 uStack_90;
  intercept_t local_88;
  undefined4 local_70;
  uint local_6c;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  FBlockThingsIterator *local_38;
  
  FBlockThingsIterator::SwitchBlock(it,bx,by);
  line = &this->trace;
  local_6c = (uint)compatible;
  uVar7 = CONCAT31(in_register_00000081,compatible);
  local_70 = CONCAT31(in_register_00000081,compatible);
  local_38 = it;
LAB_004b8065:
  do {
    do {
      aVar6.thing = FBlockThingsIterator::Next(it,SUB41(local_6c,0));
      if (aVar6.thing == (AActor *)0x0) {
        return;
      }
      if ((char)uVar7 == '\0') {
        iVar3 = 0;
        local_98 = (aVar6.thing)->radius;
        local_b8.y = ((aVar6.thing)->__Pos).Y + local_98;
        pdVar1 = &(this->trace).y;
        if (*pdVar1 <= local_b8.y && local_b8.y != *pdVar1) goto LAB_004b81dd;
        local_b8.x = ((aVar6.thing)->__Pos).X + local_98;
        local_98 = local_98 * -2.0;
        local_b8.dy = 0.0;
        do {
          iVar3 = iVar3 + 1;
          local_b8.dx = local_98;
          local_68 = local_b8.y;
          local_58 = local_b8.x;
          local_48 = local_b8.dy;
          iVar4 = P_PointOnDivlineSide(local_b8.x,local_b8.y,line);
          iVar5 = P_PointOnDivlineSide(local_98 + local_58,local_48 + local_68,line);
          if (iVar4 != iVar5) {
            dVar10 = P_InterceptVector(line,&local_b8);
            dVar9 = this->Startfrac;
            if (dVar9 <= dVar10) goto LAB_004b83cc;
            if (0.0 < dVar9) {
              local_b8.y = local_68 - ((aVar6.thing)->radius + (aVar6.thing)->radius);
              local_98 = dVar10;
              local_48 = dVar9;
              dVar9 = P_InterceptVector(line,&local_b8);
              dVar10 = local_98;
              if (local_48 <= dVar9) goto LAB_004b83cc;
            }
          }
LAB_004b81dd:
          do {
            local_b8.dy = (aVar6.thing)->radius;
            local_b8.x = ((aVar6.thing)->__Pos).X + local_b8.dy;
          } while (line->x <= local_b8.x && local_b8.x != line->x);
          local_b8.y = ((aVar6.thing)->__Pos).Y - local_b8.dy;
          local_b8.dy = local_b8.dy + local_b8.dy;
          local_98 = 0.0;
        } while( true );
      }
      dVar10 = (this->trace).dx * (this->trace).dy;
      dVar9 = (aVar6.thing)->radius;
      uStack_60 = 0x8000000000000000;
      local_68 = -dVar9;
      if (dVar10 <= 0.0) {
        uStack_60 = 0;
        local_68 = dVar9;
      }
      local_58 = ((aVar6.thing)->__Pos).X;
      dVar2 = ((aVar6.thing)->__Pos).Y;
      local_98 = local_58 - dVar9;
      local_58 = local_58 + dVar9;
      uStack_50 = 0;
      uVar8 = -(ulong)(0.0 < dVar10);
      local_48 = (double)(~uVar8 & (ulong)-dVar9 | (ulong)dVar9 & uVar8) + dVar2;
      local_68 = local_68 + dVar2;
      uStack_90 = 0;
      uStack_40 = 0x8000000000000000;
      iVar3 = P_PointOnDivlineSide(local_98,local_48,line);
      iVar4 = P_PointOnDivlineSide(local_58,local_68,line);
    } while (iVar3 == iVar4);
    local_b8.x = local_98;
    local_b8.y = local_48;
    local_b8.dx = local_58 - local_98;
    local_b8.dy = local_68 - local_48;
    dVar9 = P_InterceptVector(line,&local_b8);
  } while (dVar9 < this->Startfrac);
  goto LAB_004b840a;
LAB_004b83cc:
  local_88.isaline = false;
  local_88.done = false;
  local_88.frac = dVar10;
  local_88.d.thing = aVar6.thing;
  TArray<intercept_t,_intercept_t>::Push(&intercepts,&local_88);
  it = local_38;
  uVar7 = local_70;
  if (iVar3 == 0) {
    local_88.frac = 0.0;
    dVar9 = local_88.frac;
LAB_004b840a:
    local_88.frac = dVar9;
    local_88.isaline = false;
    local_88.done = false;
    local_88.d.thing = aVar6.thing;
    TArray<intercept_t,_intercept_t>::Push(&intercepts,&local_88);
  }
  goto LAB_004b8065;
}

Assistant:

void FPathTraverse::AddThingIntercepts (int bx, int by, FBlockThingsIterator &it, bool compatible)
{
	AActor *thing;

	it.SwitchBlock(bx, by);
	while ((thing = it.Next(compatible)))
	{
		int numfronts = 0;
		divline_t line;
		int i;


		if (!compatible)
		{
			// [RH] Don't check a corner to corner crossection for hit.
			// Instead, check against the actual bounding box (but not if compatibility optioned.)

			// There's probably a smarter way to determine which two sides
			// of the thing face the trace than by trying all four sides...
			for (i = 0; i < 4; ++i)
			{
				switch (i)
				{
				case 0:		// Top edge
					line.y = thing->Y() + thing->radius;
					if (trace.y < line.y) continue;
					line.x = thing->X() + thing->radius;
					line.dx = -thing->radius * 2;
					line.dy = 0;
					break;

				case 1:		// Right edge
					line.x = thing->X() + thing->radius;
					if (trace.x < line.x) continue;
					line.y = thing->Y() - thing->radius;
					line.dx = 0;
					line.dy = thing->radius * 2;
					break;

				case 2:		// Bottom edge
					line.y = thing->Y() - thing->radius;
					if (trace.y > line.y) continue;
					line.x = thing->X() - thing->radius;
					line.dx = thing->radius * 2;
					line.dy = 0;
					break;

				case 3:		// Left edge
					line.x = thing->X() - thing->radius;
					if (trace.x > line.x) continue;
					line.y = thing->Y() + thing->radius;
					line.dx = 0;
					line.dy = thing->radius * -2;
					break;
				}
				// Check if this side is facing the trace origin
				numfronts++;

				// If it is, see if the trace crosses it
				if (P_PointOnDivlineSide (line.x, line.y, &trace) !=
					P_PointOnDivlineSide (line.x + line.dx, line.y + line.dy, &trace))
				{
					// It's a hit
					double frac = P_InterceptVector (&trace, &line);
					if (frac < Startfrac)
					{ // behind source
						if (Startfrac > 0)
						{
							// check if the trace starts within this actor
							switch (i)
							{
							case 0:
								line.y -= 2 * thing->radius;
								break;

							case 1:
								line.x -= 2 * thing->radius;
								break;

							case 2:
								line.y += 2 * thing->radius;
								break;

							case 3:
								line.x += 2 * thing->radius;
								break;
							}
							double frac2 = P_InterceptVector(&trace, &line);
							if (frac2 >= Startfrac) goto addit;
						}
						continue;
					}
				addit:
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
					break;
				}
			}

			// If none of the sides was facing the trace, then the trace
			// must have started inside the box, so add it as an intercept.
			if (numfronts == 0)
			{
				intercept_t newintercept;
				newintercept.frac = 0;
				newintercept.isaline = false;
				newintercept.done = false;
				newintercept.d.thing = thing;
				intercepts.Push (newintercept);
			}
		}
		else
		{
			// Old code for compatibility purposes
			double 		x1, y1, x2, y2;
			int 			s1, s2;
			divline_t		dl;
			double 		frac;
				
			bool tracepositive = (trace.dx * trace.dy)>0;
						
			// check a corner to corner crossection for hit
			if (tracepositive)
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() + thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() - thing->radius;					
			}
			else
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() - thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() + thing->radius;					
			}
			
			s1 = P_PointOnDivlineSide (x1, y1, &trace);
			s2 = P_PointOnDivlineSide (x2, y2, &trace);

			if (s1 != s2)
			{
				dl.x = x1;
				dl.y = y1;
				dl.dx = x2-x1;
				dl.dy = y2-y1;
				
				frac = P_InterceptVector (&trace, &dl);

				if (frac >= Startfrac)
				{
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
				}
			}
		}
	}
}